

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O2

int64_t av1_estimate_txfm_yrd
                  (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int64_t ref_best_rd,BLOCK_SIZE bs,
                  TX_SIZE tx_size)

{
  MACROBLOCKD *xd;
  uint uVar1;
  MB_MODE_INFO *pMVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int64_t iVar9;
  long lVar10;
  int plane;
  uint __c;
  long lVar11;
  long lVar12;
  long lVar13;
  ENTROPY_CONTEXT *l;
  long lVar14;
  long lVar15;
  RD_STATS local_170;
  RD_STATS *local_148;
  long local_140;
  size_t local_138;
  size_t local_130;
  ulong local_128;
  ENTROPY_CONTEXT *local_120;
  long local_118;
  TXB_CTX txb_ctx;
  TxfmParam txfm_param;
  ENTROPY_CONTEXT local_e0 [32];
  ENTROPY_CONTEXT local_c0 [32];
  RD_STATS local_a0;
  long local_78;
  int64_t local_70;
  int local_68;
  int local_64;
  QUANT_PARAM quant_param;
  
  pMVar2 = *(x->e_mbd).mi;
  bVar3 = true;
  if ((pMVar2->field_0xa7 & 0x80) == 0) {
    bVar3 = '\0' < pMVar2->ref_frame[0];
  }
  xd = &x->e_mbd;
  iVar4 = 0;
  local_148 = rd_stats;
  if (((x->txfm_search_params).tx_mode_search_type == '\x02') &&
     (iVar4 = 0, pMVar2->bsize != BLOCK_4X4)) {
    iVar4 = txfm_partition_context
                      ((x->e_mbd).above_txfm_context,(x->e_mbd).left_txfm_context,pMVar2->bsize,
                       tx_size);
    iVar4 = (x->mode_costs).txfm_partition_cost[iVar4][0];
  }
  uVar5 = av1_get_skip_txfm_context(xd);
  lVar10 = (long)(x->mode_costs).skip_txfm_cost[uVar5][1];
  iVar6 = (x->mode_costs).skip_txfm_cost[uVar5][0] + iVar4;
  lVar11 = x->rdmult * lVar10 + 0x100 >> 9;
  lVar13 = (long)iVar6 * (long)x->rdmult + 0x100 >> 9;
  pMVar2->tx_size = tx_size;
  uVar5 = *(uint *)((long)tx_size_wide_unit + (ulong)((uint)tx_size * 4));
  uVar1 = *(uint *)((long)tx_size_high_unit + (ulong)((uint)tx_size * 4));
  local_128 = (ulong)((uVar1 & 0xff) * (uVar5 & 0xff));
  iVar7 = max_block_wide(xd,bs,uVar5);
  iVar8 = max_block_high(xd,bs,plane);
  memset(local_e0,0,0x88);
  local_78 = lVar13;
  if (lVar11 <= lVar13) {
    local_78 = lVar11;
  }
  lVar11 = 0;
  local_a0.sse = 0;
  local_a0.dist = 0;
  local_a0.rdcost = 0;
  local_a0.skip_txfm = '\x01';
  local_70 = ref_best_rd;
  av1_get_entropy_contexts(bs,(x->e_mbd).plane,local_e0,local_c0);
  local_130 = (size_t)(int)uVar5;
  local_138 = (size_t)(int)uVar1;
  local_118 = (long)iVar7;
  local_140 = (long)iVar8;
  lVar13 = 0;
  do {
    if ((local_140 <= lVar11) || (local_64 != 0)) {
      if (local_64 != 0) {
        local_a0.rate = 0x7fffffff;
        local_a0.zero_rate = 0;
        local_a0.dist = 0x7fffffffffffffff;
        local_a0.rdcost = 0x7fffffffffffffff;
        local_a0.sse = 0x7fffffffffffffff;
        local_a0.skip_txfm = '\0';
      }
      local_148->rate = local_a0.rate;
      local_148->zero_rate = local_a0.zero_rate;
      local_148->dist = local_a0.dist;
      *(ulong *)&local_148->skip_txfm = CONCAT71(local_a0._33_7_,local_a0.skip_txfm);
      local_148->rdcost = local_a0.rdcost;
      local_148->sse = local_a0.sse;
      iVar7 = local_148->rate;
      iVar9 = 0x7fffffffffffffff;
      if (iVar7 != 0x7fffffff) {
        if ((bool)(local_148->skip_txfm != '\0' & bVar3)) {
          iVar9 = local_148->sse * 0x80 + (x->rdmult * lVar10 + 0x100 >> 9);
        }
        else {
          iVar8 = x->rdmult;
          iVar9 = local_148->dist * 0x80 + ((long)(iVar6 + iVar7) * (long)iVar8 + 0x100 >> 9);
          local_148->rate = iVar4 + iVar7;
          if ((bVar3 && local_148->skip_txfm == '\0') &&
             ((x->e_mbd).lossless[*(ushort *)&pMVar2->field_0xa7 & 7] == 0)) {
            lVar10 = local_148->sse * 0x80 + (iVar8 * lVar10 + 0x100 >> 9);
            if (lVar10 <= iVar9) {
              local_148->rate = 0;
              local_148->dist = local_148->sse;
              local_148->skip_txfm = '\x01';
              iVar9 = lVar10;
            }
          }
        }
      }
      return iVar9;
    }
    l = local_c0 + lVar11;
    lVar13 = (long)(int)lVar13;
    local_120 = l;
    for (lVar15 = 0; lVar15 < local_118; lVar15 = lVar15 + ((ulong)uVar5 & 0xff)) {
      local_170.dist = 0;
      local_170.rdcost = 0;
      local_170.sse = 0;
      local_170.skip_txfm = 1;
      local_170.zero_rate = 0;
      if (local_68 != 0) {
        local_64 = 1;
        break;
      }
      get_txb_ctx(bs,tx_size,0,local_e0 + lVar15,l,&txb_ctx);
      av1_setup_xform(&cpi->common,x,tx_size,'\0',&txfm_param);
      av1_setup_quant(tx_size,0,1,0,&quant_param);
      iVar7 = (int)lVar13;
      av1_xform(x,0,iVar7,(int)lVar11,(int)lVar15,bs,&txfm_param);
      av1_quant(x,0,iVar7,&txfm_param,&quant_param);
      local_170.rate = av1_cost_coeffs_txb(x,0,iVar7,tx_size,txfm_param.tx_type,&txb_ctx,0);
      dist_block_tx_domain
                (x,0,iVar7,tx_size,quant_param.qmatrix,
                 av1_scan_orders[txfm_param.tx_size][txfm_param.tx_type].scan,&local_170.dist,
                 &local_170.sse);
      lVar12 = local_170.dist * 0x80 + ((long)x->rdmult * (long)local_170.rate + 0x100 >> 9);
      lVar14 = local_170.sse * 0x80;
      local_170.skip_txfm = local_170.skip_txfm & x->plane[0].eobs[lVar13] == 0;
      av1_merge_rd_stats(&local_a0,&local_170);
      if (lVar12 < lVar14) {
        lVar14 = lVar12;
      }
      local_78 = lVar14 + local_78;
      if (ref_best_rd < local_78) {
        local_68 = 1;
        break;
      }
      __c = (uint)x->plane[0].txb_entropy_ctx[lVar13];
      memset(local_e0 + lVar15,__c,local_130);
      l = local_120;
      memset(local_120,__c,local_138);
      lVar13 = lVar13 + local_128;
    }
    lVar11 = lVar11 + ((ulong)uVar1 & 0xff);
  } while( true );
}

Assistant:

int64_t av1_estimate_txfm_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              RD_STATS *rd_stats, int64_t ref_best_rd,
                              BLOCK_SIZE bs, TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int is_inter = is_inter_block(mbmi);
  const int tx_select = txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
                        block_signals_txsize(mbmi->bsize);
  int tx_size_rate = 0;
  if (tx_select) {
    const int ctx = txfm_partition_context(
        xd->above_txfm_context, xd->left_txfm_context, mbmi->bsize, tx_size);
    tx_size_rate = mode_costs->txfm_partition_cost[ctx][0];
  }
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int no_skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][0];
  const int skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][1];
  const int64_t skip_txfm_rd = RDCOST(x->rdmult, skip_txfm_rate, 0);
  const int64_t no_this_rd =
      RDCOST(x->rdmult, no_skip_txfm_rate + tx_size_rate, 0);
  mbmi->tx_size = tx_size;

  const uint8_t txw_unit = tx_size_wide_unit[tx_size];
  const uint8_t txh_unit = tx_size_high_unit[tx_size];
  const int step = txw_unit * txh_unit;
  const int max_blocks_wide = max_block_wide(xd, bs, 0);
  const int max_blocks_high = max_block_high(xd, bs, 0);

  struct rdcost_block_args args;
  av1_zero(args);
  args.x = x;
  args.cpi = cpi;
  args.best_rd = ref_best_rd;
  args.current_rd = AOMMIN(no_this_rd, skip_txfm_rd);
  av1_init_rd_stats(&args.rd_stats);
  av1_get_entropy_contexts(bs, &xd->plane[0], args.t_above, args.t_left);
  int i = 0;
  for (int blk_row = 0; blk_row < max_blocks_high && !args.incomplete_exit;
       blk_row += txh_unit) {
    for (int blk_col = 0; blk_col < max_blocks_wide; blk_col += txw_unit) {
      RD_STATS this_rd_stats;
      av1_init_rd_stats(&this_rd_stats);

      if (args.exit_early) {
        args.incomplete_exit = 1;
        break;
      }

      ENTROPY_CONTEXT *a = args.t_above + blk_col;
      ENTROPY_CONTEXT *l = args.t_left + blk_row;
      TXB_CTX txb_ctx;
      get_txb_ctx(bs, tx_size, 0, a, l, &txb_ctx);

      TxfmParam txfm_param;
      QUANT_PARAM quant_param;
      av1_setup_xform(&cpi->common, x, tx_size, DCT_DCT, &txfm_param);
      av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_B, 0, &quant_param);

      av1_xform(x, 0, i, blk_row, blk_col, bs, &txfm_param);
      av1_quant(x, 0, i, &txfm_param, &quant_param);

      this_rd_stats.rate =
          cost_coeffs(x, 0, i, tx_size, txfm_param.tx_type, &txb_ctx, 0);

      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, 0, i, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);

      const int64_t no_skip_txfm_rd =
          RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
      const int64_t skip_rd = RDCOST(x->rdmult, 0, this_rd_stats.sse);

      this_rd_stats.skip_txfm &= !x->plane[0].eobs[i];

      av1_merge_rd_stats(&args.rd_stats, &this_rd_stats);
      args.current_rd += AOMMIN(no_skip_txfm_rd, skip_rd);

      if (args.current_rd > ref_best_rd) {
        args.exit_early = 1;
        break;
      }

      av1_set_txb_context(x, 0, i, tx_size, a, l);
      i += step;
    }
  }

  if (args.incomplete_exit) av1_invalid_rd_stats(&args.rd_stats);

  *rd_stats = args.rd_stats;
  if (rd_stats->rate == INT_MAX) return INT64_MAX;

  int64_t rd;
  // rdstats->rate should include all the rate except skip/non-skip cost as the
  // same is accounted in the caller functions after rd evaluation of all
  // planes. However the decisions should be done after considering the
  // skip/non-skip header cost
  if (rd_stats->skip_txfm && is_inter) {
    rd = RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
  } else {
    // Intra blocks are always signalled as non-skip
    rd = RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_rate + tx_size_rate,
                rd_stats->dist);
    rd_stats->rate += tx_size_rate;
  }
  // Check if forcing the block to skip transform leads to smaller RD cost.
  if (is_inter && !rd_stats->skip_txfm && !xd->lossless[mbmi->segment_id]) {
    int64_t temp_skip_txfm_rd =
        RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
    if (temp_skip_txfm_rd <= rd) {
      rd = temp_skip_txfm_rd;
      rd_stats->rate = 0;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
    }
  }

  return rd;
}